

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coin.cpp
# Opt level: O3

void node::FindCoins(NodeContext *node,
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    *coins)

{
  bool bVar1;
  Chainstate *this;
  CCoinsViewCache *baseIn;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  long in_FS_OFFSET;
  CCoinsViewMemPool mempool_view;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  CCoinsViewMemPool local_f0;
  unique_lock<std::recursive_mutex> local_48;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((node->mempool)._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
      super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
      super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl == (CTxMemPool *)0x0) {
    __assert_fail("node.mempool",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/coin.cpp"
                  ,0xe,"void node::FindCoins(const NodeContext &, std::map<COutPoint, Coin> &)");
  }
  if ((node->chainman)._M_t.
      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
      super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl != (ChainstateManager *)0x0) {
    local_38._M_device = &cs_main.super_recursive_mutex;
    local_38._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_38);
    local_48._M_device =
         &(((node->mempool)._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
            ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl)->cs).super_recursive_mutex;
    local_48._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_48);
    this = ChainstateManager::ActiveChainstate
                     ((node->chainman)._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    baseIn = Chainstate::CoinsTip(this);
    CCoinsViewMemPool::CCoinsViewMemPool
              (&local_f0,(CCoinsView *)baseIn,
               (node->mempool)._M_t.
               super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
               super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
               super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
    p_Var2 = (coins->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(coins->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      do {
        bVar1 = CCoinsViewMemPool::GetCoin
                          (&local_f0,(COutPoint *)(p_Var2 + 1),(Coin *)&p_Var2[2]._M_parent);
        if (!bVar1) {
          Coin::Clear((Coin *)&p_Var2[2]._M_parent);
        }
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
    local_f0.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
         (_func_int **)&PTR_GetCoin_00b255a8;
    std::
    _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_f0.m_non_base_coins._M_h);
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::allocator<std::pair<const_COutPoint,_Coin>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_f0.m_temp_added._M_h);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("node.chainman",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/coin.cpp"
                ,0xf,"void node::FindCoins(const NodeContext &, std::map<COutPoint, Coin> &)");
}

Assistant:

void FindCoins(const NodeContext& node, std::map<COutPoint, Coin>& coins)
{
    assert(node.mempool);
    assert(node.chainman);
    LOCK2(cs_main, node.mempool->cs);
    CCoinsViewCache& chain_view = node.chainman->ActiveChainstate().CoinsTip();
    CCoinsViewMemPool mempool_view(&chain_view, *node.mempool);
    for (auto& coin : coins) {
        if (!mempool_view.GetCoin(coin.first, coin.second)) {
            // Either the coin is not in the CCoinsViewCache or is spent. Clear it.
            coin.second.Clear();
        }
    }
}